

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O0

ImgProcessor * __thiscall
pobr::imgProcessing::ImgProcessor::processPreEnhance(ImgProcessor *this,Mat *img,bool *isProfiling)

{
  byte *in_RCX;
  double dVar1;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  PerformanceTimer profiler;
  bool *isProfiling_local;
  Mat *img_local;
  ImgProcessor *this_local;
  Mat *resultImg;
  
  profiler.pointStop.__d.__r._7_1_ = 0;
  cv::Mat::Mat(&this->img,(Mat *)isProfiling);
  pobr::utils::PerformanceTimer::PerformanceTimer((PerformanceTimer *)local_40);
  pobr::utils::PerformanceTimer::start((PerformanceTimer *)local_40);
  pobr::utils::PerformanceTimer::stop((PerformanceTimer *)local_40);
  if ((*in_RCX & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"PreEnhance phase took: ",&local_b1);
    dVar1 = pobr::utils::PerformanceTimer::getDurationNS((PerformanceTimer *)local_40);
    std::__cxx11::to_string(&local_d8,dVar1 / 1000000.0);
    std::operator+(&local_90,&local_b0,&local_d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"ms",&local_f9);
    std::operator+(&local_70,&local_90,&local_f8);
    pobr::utils::Logger::notice(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  return this;
}

Assistant:

cv::Mat
ImgProcessor::processPreEnhance(const cv::Mat& img, const bool& isProfiling)
const
{
    auto resultImg = img;

    PerformanceTimer profiler;

    profiler.start();

    // Note: disabled, as not needed
    //       supplied images are rather sharp

    // resultImg = enhance::unsharpMasking(resultImg);

    profiler.stop();

    if (isProfiling) {
        Logger::notice(
            std::string("PreEnhance phase took: ") +
            std::to_string(profiler.getDurationNS() / 1000000) +
            std::string("ms")
        );
    }

    return resultImg;
}